

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O2

ZoneHashNode * __thiscall asmjit::ZoneHashBase::_del(ZoneHashBase *this,ZoneHashNode *node)

{
  ZoneHashNode *pZVar1;
  ZoneHashNode *pZVar2;
  
  pZVar1 = (ZoneHashNode *)(this->_data + (ulong)*(uint *)(node + 8) % (ulong)this->_bucketsCount);
  do {
    pZVar2 = pZVar1;
    pZVar1 = *(ZoneHashNode **)pZVar2;
    if (pZVar1 == (ZoneHashNode *)0x0) {
      return (ZoneHashNode *)0x0;
    }
  } while (pZVar1 != node);
  *(long *)pZVar2 = *(long *)pZVar1;
  return node;
}

Assistant:

ZoneHashNode* ZoneHashBase::_del(ZoneHashNode* node) noexcept {
  uint32_t hMod = node->_hVal % _bucketsCount;

  ZoneHashNode** pPrev = &_data[hMod];
  ZoneHashNode* p = *pPrev;

  while (p) {
    if (p == node) {
      *pPrev = p->_hashNext;
      return node;
    }

    pPrev = &p->_hashNext;
    p = *pPrev;
  }

  return nullptr;
}